

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cpp
# Opt level: O2

Result<wasm::Literal> *
wasm::WATParser::anon_unknown_21::const_(Result<wasm::Literal> *__return_storage_ptr__,Lexer *in)

{
  bool bVar1;
  optional<unsigned_int> oVar2;
  string *this;
  string_view expected;
  string local_98;
  string local_78;
  Literal local_58;
  Err local_40;
  
  expected._M_str = "ref.extern";
  expected._M_len = 10;
  bVar1 = Lexer::takeSExprStart(in,expected);
  if (bVar1) {
    oVar2 = Lexer::takeI<unsigned_int>(in);
    if (((ulong)oVar2.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                super__Optional_payload_base<unsigned_int> >> 0x20 & 1) == 0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_98,"expected host reference payload",(allocator<char> *)&local_58)
      ;
      Lexer::err(&local_40,in,&local_98);
      std::__detail::__variant::_Variant_storage<false,wasm::Literal,wasm::Err>::
      _Variant_storage<1ul,wasm::Err>
                ((_Variant_storage<false,wasm::Literal,wasm::Err> *)__return_storage_ptr__,&local_40
                );
      std::__cxx11::string::~string((string *)&local_40);
      this = &local_98;
    }
    else {
      bVar1 = Lexer::takeRParen(in);
      if (bVar1) {
        Literal::makeI31(&local_58,
                         oVar2.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                         super__Optional_payload_base<unsigned_int>._M_payload,Unshared);
        Literal::externalize((Literal *)&local_40,&local_58);
        std::__detail::__variant::_Variant_storage<false,wasm::Literal,wasm::Err>::
        _Variant_storage<0ul,wasm::Literal>
                  ((_Variant_storage<false,wasm::Literal,wasm::Err> *)__return_storage_ptr__,
                   &local_40);
        Literal::~Literal((Literal *)&local_40);
        Literal::~Literal(&local_58);
        return __return_storage_ptr__;
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_78,"expected end of ref.extern",(allocator<char> *)&local_58);
      Lexer::err(&local_40,in,&local_78);
      std::__detail::__variant::_Variant_storage<false,wasm::Literal,wasm::Err>::
      _Variant_storage<1ul,wasm::Err>
                ((_Variant_storage<false,wasm::Literal,wasm::Err> *)__return_storage_ptr__,&local_40
                );
      std::__cxx11::string::~string((string *)&local_40);
      this = &local_78;
    }
    std::__cxx11::string::~string((string *)this);
  }
  else {
    parseConst(__return_storage_ptr__,in);
  }
  return __return_storage_ptr__;
}

Assistant:

Result<Literal> const_(Lexer& in) {
  if (in.takeSExprStart("ref.extern"sv)) {
    auto n = in.takeI32();
    if (!n) {
      return in.err("expected host reference payload");
    }
    if (!in.takeRParen()) {
      return in.err("expected end of ref.extern");
    }
    // Represent host references as externalized i31s.
    return Literal::makeI31(*n, Unshared).externalize();
  }
  return parseConst(in);
}